

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_o1.cc
# Opt level: O0

void __thiscall
lf::geometry::Parallelogram::Parallelogram
          (Parallelogram *this,VectorXd *p0,VectorXd *p1,VectorXd *p2)

{
  VectorXd *pVVar1;
  Index IVar2;
  Index IVar3;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *other;
  ColXpr local_668;
  ColXpr local_630;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_5f8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_5e0;
  ColXpr local_5b8;
  ColXpr local_580;
  allocator<char> local_541;
  string local_540;
  allocator<char> local_519;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  string local_4d0;
  allocator<char> local_4a9;
  string local_4a8;
  allocator<char> local_481;
  string local_480;
  stringstream local_460 [8];
  stringstream ss_1;
  ostream local_450 [383];
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  string local_260;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  stringstream local_1f0 [8];
  stringstream ss;
  ostream local_1e0 [380];
  int local_64;
  Index local_60;
  int local_54;
  Index local_50 [3];
  int local_34;
  Index local_30;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_28;
  VectorXd *p2_local;
  VectorXd *p1_local;
  VectorXd *p0_local;
  Parallelogram *this_local;
  
  local_28 = (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)p2;
  p2_local = p1;
  p1_local = p0;
  p0_local = (VectorXd *)this;
  Geometry::Geometry(&this->super_Geometry);
  (this->super_Geometry)._vptr_Geometry = (_func_int **)&PTR_DimLocal_00e79a20;
  local_30 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
                       (&p1_local->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>);
  local_34 = 4;
  Eigen::Matrix<double,-1,4,0,-1,4>::Matrix<long,int>
            ((Matrix<double,_1,4,0,_1,4> *)&this->coords_,&local_30,&local_34);
  local_50[0] = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
                          (&p1_local->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                          );
  local_54 = 2;
  Eigen::Matrix<double,-1,2,0,-1,2>::Matrix<long,int>
            ((Matrix<double,_1,2,0,_1,2> *)&this->jacobian_,local_50,&local_54);
  local_60 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
                       (&p1_local->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>);
  local_64 = 2;
  Eigen::Matrix<double,-1,2,0,-1,2>::Matrix<long,int>
            ((Matrix<double,_1,2,0,_1,2> *)&this->jacobian_inverse_gramian_,&local_60,&local_64);
  this->integrationElement_ = 0.0;
  IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)p1_local);
  IVar3 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)p2_local);
  if (IVar2 != IVar3) {
    std::__cxx11::stringstream::stringstream(local_1f0);
    std::operator<<(local_1e0,"Vector length mismatch p0 <-> p1");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,"p0.size() == p1.size()",&local_211);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
               ,&local_239);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_210,&local_238,0x118,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator(&local_239);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator(&local_211);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"false",&local_281);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
               ,&local_2a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"",&local_2d1);
    lf::base::AssertionFailed(&local_280,&local_2a8,0x118,&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator(&local_2d1);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator(&local_2a9);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator(&local_281);
    abort();
  }
  IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)p1_local);
  IVar3 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size(local_28);
  pVVar1 = p1_local;
  if (IVar2 != IVar3) {
    std::__cxx11::stringstream::stringstream(local_460);
    std::operator<<(local_450,"Vector length mismatch p0 <-> p2");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_480,"p0.size() == p2.size()",&local_481);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4a8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
               ,&local_4a9);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_480,&local_4a8,0x119,&local_4d0);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::allocator<char>::~allocator(&local_4a9);
    std::__cxx11::string::~string((string *)&local_480);
    std::allocator<char>::~allocator(&local_481);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f0,"false",&local_4f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_518,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
               ,&local_519);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_540,"",&local_541);
    lf::base::AssertionFailed(&local_4f0,&local_518,0x119,&local_540);
    std::__cxx11::string::~string((string *)&local_540);
    std::allocator<char>::~allocator(&local_541);
    std::__cxx11::string::~string((string *)&local_518);
    std::allocator<char>::~allocator(&local_519);
    std::__cxx11::string::~string((string *)&local_4f0);
    std::allocator<char>::~allocator(&local_4f1);
    abort();
  }
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
            (&local_580,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)&this->coords_,0);
  Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>,-1,1,true>::operator=
            ((Block<Eigen::Matrix<double,_1,4,0,_1,4>,_1,1,true> *)&local_580,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)pVVar1);
  pVVar1 = p2_local;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
            (&local_5b8,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)&this->coords_,1);
  Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>,-1,1,true>::operator=
            ((Block<Eigen::Matrix<double,_1,4,0,_1,4>,_1,1,true> *)&local_5b8,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)pVVar1);
  pVVar1 = p2_local;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            (&local_5f8,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_28,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)p1_local);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
            (&local_5e0,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)pVVar1,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_5f8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
            (&local_630,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)&this->coords_,2);
  Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>,-1,1,true>::operator=
            ((Block<Eigen::Matrix<double,_1,4,0,_1,4>,_1,1,true> *)&local_630,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_5e0);
  other = local_28;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
            (&local_668,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)&this->coords_,3);
  Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>,-1,1,true>::operator=
            ((Block<Eigen::Matrix<double,_1,4,0,_1,4>,_1,1,true> *)&local_668,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)other);
  assertNonDegenerateQuad(&this->coords_,1e-08);
  init(this,(EVP_PKEY_CTX *)other);
  return;
}

Assistant:

Parallelogram::Parallelogram(const Eigen::VectorXd& p0,
                             const Eigen::VectorXd& p1,
                             const Eigen::VectorXd& p2)
    : coords_(p0.rows(), 4),
      jacobian_(p0.rows(), 2),
      jacobian_inverse_gramian_(p0.rows(), 2),
      integrationElement_(0) {
  LF_ASSERT_MSG(p0.size() == p1.size(), "Vector length mismatch p0 <-> p1");
  LF_ASSERT_MSG(p0.size() == p2.size(), "Vector length mismatch p0 <-> p2");
  coords_.col(0) = p0;
  coords_.col(1) = p1;
  coords_.col(2) = p1 + (p2 - p0);
  coords_.col(3) = p2;
  assertNonDegenerateQuad(coords_);
  init();
}